

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

void __thiscall Refal2::CSetBuilder<int>::Reset(CSetBuilder<int> *this)

{
  CSetBuilder<int> *this_local;
  
  this->fullSetStatus = S_Thru;
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear(&this->yes);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear(&this->no);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear(&this->thru);
  return;
}

Assistant:

void CSetBuilder<T>::Reset()
{
	fullSetStatus = S_Thru;
	yes.clear();
	no.clear();
	thru.clear();
}